

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderV2fAttribute(ImfHeader *hdr,char *name,float *x,float *y)

{
  TypedAttribute<Imath_3_2::Vec2<float>_> *pTVar1;
  
  pTVar1 = Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<Imath_3_2::Vec2<float>>>
                     ((Header *)hdr,name);
  *x = (pTVar1->_value).x;
  *y = (pTVar1->_value).y;
  return 1;
}

Assistant:

int
ImfHeaderV2fAttribute (
    const ImfHeader* hdr, const char name[], float* x, float* y)
{
    try
    {
        const V2f& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2fAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}